

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex_nivalis_conv.cpp
# Opt level: O3

string * nivalis::latex_to_nivalis(string *__return_storage_ptr__,string *expr_in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  long *plVar8;
  char *pcVar9;
  ulong uVar10;
  size_type *psVar11;
  ulong uVar12;
  string *psVar13;
  byte c;
  long lVar14;
  ulong uVar15;
  char cVar16;
  _Alloc_hider _Var17;
  long *in_FS_OFFSET;
  string_view src;
  string_view src_00;
  string_view src_01;
  string_view src_02;
  string_view src_03;
  string_view src_04;
  string_view src_05;
  string_view src_06;
  string_view src_07;
  string_view src_08;
  string_view src_09;
  string_view src_10;
  string_view src_11;
  string_view src_12;
  string_view src_13;
  initializer_list<char> __l;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_00;
  initializer_list<char> __l_01;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_02;
  initializer_list<char> __l_03;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_04;
  initializer_list<char> __l_05;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_06;
  initializer_list<char> __l_07;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_08;
  initializer_list<char> __l_09;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_10;
  initializer_list<char> __l_11;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_12;
  initializer_list<char> __l_13;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_14;
  string_view to;
  string_view to_00;
  string_view to_01;
  string_view to_02;
  string_view to_03;
  string_view to_04;
  string_view to_05;
  string_view to_06;
  string_view to_07;
  string_view to_08;
  string_view to_09;
  string_view to_10;
  string_view to_11;
  string expr;
  string tmp_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __result;
  string local_3e8;
  string local_3c8;
  undefined1 local_3a8 [8];
  _Alloc_hider local_3a0;
  undefined1 local_398 [24];
  undefined4 local_380;
  undefined1 *local_378;
  undefined8 local_370;
  undefined1 local_368 [16];
  undefined4 local_358;
  long *local_350 [2];
  long local_340 [2];
  undefined4 local_330;
  undefined1 *local_328;
  undefined8 local_320;
  undefined1 local_318 [16];
  undefined4 local_308;
  long *local_300 [2];
  long local_2f0 [2];
  string local_2e0;
  ulong local_2c0;
  string *local_2b8;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((char)in_FS_OFFSET[-0x7c] == '\0') {
    lVar14 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x86] = lVar14 + -0x420;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar14 + -0x430),"\\sqrt","");
    local_3e8._M_dataplus._M_p._0_2_ = 0x7b5b;
    psVar13 = &local_3c8;
    __l._M_len = 2;
    __l._M_array = (iterator)&local_3e8;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar14 + -0x410),__l,
               (allocator_type *)psVar13);
    local_3a8._0_4_ = 0xffffffff;
    local_3a0._M_p = local_398 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"(","");
    local_378 = local_368;
    local_380 = 1;
    local_370 = 0;
    local_368[0] = 0;
    local_358 = 0xffffffff;
    local_350[0] = local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,")^(1/(","");
    local_328 = local_318;
    local_330 = 0;
    local_320 = 0;
    local_318[0] = 0;
    local_308 = 0xffffffff;
    plVar8 = local_2f0;
    local_300[0] = plVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"))","");
    __l_00._M_len = 5;
    __l_00._M_array = (iterator)local_3a8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x3f8),__l_00,(allocator_type *)psVar13);
    lVar14 = -200;
    do {
      if (plVar8 != (long *)plVar8[-2]) {
        operator_delete((long *)plVar8[-2],*plVar8 + 1);
      }
      plVar8 = plVar8 + -5;
      lVar14 = lVar14 + 0x28;
    } while (lVar14 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x430,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x7c) = 1;
  }
  if ((char)in_FS_OFFSET[-0x71] == '\0') {
    lVar14 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x7b] = lVar14 + -0x3c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar14 + -0x3d8),"\\sqrt","");
    local_3e8._M_dataplus._M_p._0_1_ = 0x7b;
    psVar13 = &local_3c8;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_3e8;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar14 + -0x3b8),__l_01,
               (allocator_type *)psVar13);
    local_3a8._0_4_ = 0xffffffff;
    local_3a0._M_p = local_398 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"sqrt(","");
    local_378 = local_368;
    local_380 = 0;
    local_370 = 0;
    local_368[0] = 0;
    local_358 = 0xffffffff;
    plVar8 = local_340;
    local_350[0] = plVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,")","");
    __l_02._M_len = 3;
    __l_02._M_array = (iterator)local_3a8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x3a0),__l_02,(allocator_type *)psVar13);
    lVar14 = -0x78;
    do {
      if (plVar8 != (long *)plVar8[-2]) {
        operator_delete((long *)plVar8[-2],*plVar8 + 1);
      }
      plVar8 = plVar8 + -5;
      lVar14 = lVar14 + 0x28;
    } while (lVar14 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x3d8,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x71) = 1;
  }
  if ((char)in_FS_OFFSET[-0x66] == '\0') {
    lVar14 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x70] = lVar14 + -0x370;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar14 + -0x380),"\\frac","");
    local_3e8._M_dataplus._M_p._0_2_ = 0x7b7b;
    psVar13 = &local_3c8;
    __l_03._M_len = 2;
    __l_03._M_array = (iterator)&local_3e8;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar14 + -0x360),__l_03,
               (allocator_type *)psVar13);
    local_3a8._0_4_ = 0xffffffff;
    local_3a0._M_p = local_398 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"((","");
    local_378 = local_368;
    local_380 = 0;
    local_370 = 0;
    local_368[0] = 0;
    local_358 = 0xffffffff;
    local_350[0] = local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,")/(","");
    local_328 = local_318;
    local_330 = 1;
    local_320 = 0;
    local_318[0] = 0;
    local_308 = 0xffffffff;
    plVar8 = local_2f0;
    local_300[0] = plVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"))","");
    __l_04._M_len = 5;
    __l_04._M_array = (iterator)local_3a8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x348),__l_04,(allocator_type *)psVar13);
    lVar14 = -200;
    do {
      if (plVar8 != (long *)plVar8[-2]) {
        operator_delete((long *)plVar8[-2],*plVar8 + 1);
      }
      plVar8 = plVar8 + -5;
      lVar14 = lVar14 + 0x28;
    } while (lVar14 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x380,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x66) = 1;
  }
  if ((char)in_FS_OFFSET[-0x5b] == '\0') {
    lVar14 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x65] = lVar14 + -0x318;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar14 + -0x328),"\\log_","");
    local_3e8._M_dataplus._M_p._0_2_ = 0x287b;
    psVar13 = &local_3c8;
    __l_05._M_len = 2;
    __l_05._M_array = (iterator)&local_3e8;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar14 + -0x308),__l_05,
               (allocator_type *)psVar13);
    local_3a8._0_4_ = 0xffffffff;
    local_3a0._M_p = local_398 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"log(","");
    local_378 = local_368;
    local_380 = 1;
    local_370 = 0;
    local_368[0] = 0;
    local_358 = 0xffffffff;
    local_350[0] = local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,", ","");
    local_328 = local_318;
    local_330 = 0;
    local_320 = 0;
    local_318[0] = 0;
    local_308 = 0xffffffff;
    plVar8 = local_2f0;
    local_300[0] = plVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_300,")","");
    __l_06._M_len = 5;
    __l_06._M_array = (iterator)local_3a8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x2f0),__l_06,(allocator_type *)psVar13);
    lVar14 = -200;
    do {
      if (plVar8 != (long *)plVar8[-2]) {
        operator_delete((long *)plVar8[-2],*plVar8 + 1);
      }
      plVar8 = plVar8 + -5;
      lVar14 = lVar14 + 0x28;
    } while (lVar14 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x328,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x5b) = 1;
  }
  if ((char)in_FS_OFFSET[-0x50] == '\0') {
    lVar14 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x5a] = lVar14 + -0x2c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar14 + -0x2d0),"\\sum_","");
    local_3e8._M_dataplus._M_p._0_2_ = 0x5e7b;
    psVar13 = &local_3c8;
    __l_07._M_len = 2;
    __l_07._M_array = (iterator)&local_3e8;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar14 + -0x2b0),__l_07,
               (allocator_type *)psVar13);
    local_3a8._0_4_ = 0xffffffff;
    local_3a0._M_p = local_398 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"sum(","");
    local_378 = local_368;
    local_380 = 0;
    local_370 = 0;
    local_368[0] = 0;
    local_358 = 0xffffffff;
    local_350[0] = local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,", ","");
    local_328 = local_318;
    local_330 = 1;
    local_320 = 0;
    local_318[0] = 0;
    local_308 = 0xffffffff;
    plVar8 = local_2f0;
    local_300[0] = plVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_300,")\v","");
    __l_08._M_len = 5;
    __l_08._M_array = (iterator)local_3a8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x298),__l_08,(allocator_type *)psVar13);
    lVar14 = -200;
    do {
      if (plVar8 != (long *)plVar8[-2]) {
        operator_delete((long *)plVar8[-2],*plVar8 + 1);
      }
      plVar8 = plVar8 + -5;
      lVar14 = lVar14 + 0x28;
    } while (lVar14 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x2d0,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x50) = 1;
  }
  if ((char)in_FS_OFFSET[-0x45] == '\0') {
    lVar14 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x4f] = lVar14 + -0x268;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar14 + -0x278),"\\prod_","");
    local_3e8._M_dataplus._M_p._0_2_ = 0x5e7b;
    psVar13 = &local_3c8;
    __l_09._M_len = 2;
    __l_09._M_array = (iterator)&local_3e8;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar14 + -600),__l_09,
               (allocator_type *)psVar13);
    local_3a8._0_4_ = 0xffffffff;
    local_3a0._M_p = local_398 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"prod(","");
    local_378 = local_368;
    local_380 = 0;
    local_370 = 0;
    local_368[0] = 0;
    local_358 = 0xffffffff;
    local_350[0] = local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,", ","");
    local_328 = local_318;
    local_330 = 1;
    local_320 = 0;
    local_318[0] = 0;
    local_308 = 0xffffffff;
    plVar8 = local_2f0;
    local_300[0] = plVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_300,")\v","");
    __l_10._M_len = 5;
    __l_10._M_array = (iterator)local_3a8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x240),__l_10,(allocator_type *)psVar13);
    lVar14 = -200;
    do {
      if (plVar8 != (long *)plVar8[-2]) {
        operator_delete((long *)plVar8[-2],*plVar8 + 1);
      }
      plVar8 = plVar8 + -5;
      lVar14 = lVar14 + 0x28;
    } while (lVar14 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x278,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x45) = 1;
  }
  if ((char)in_FS_OFFSET[-0x3a] == '\0') {
    lVar14 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x44] = lVar14 + -0x210;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar14 + -0x220),"\\int_","");
    local_3e8._M_dataplus._M_p._0_2_ = 0x5e7b;
    psVar13 = &local_3c8;
    __l_11._M_len = 2;
    __l_11._M_array = (iterator)&local_3e8;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar14 + -0x200),__l_11,
               (allocator_type *)psVar13);
    local_3a8._0_4_ = 0xffffffff;
    local_3a0._M_p = local_398 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"int(","");
    local_378 = local_368;
    local_380 = 0;
    local_370 = 0;
    local_368[0] = 0;
    local_358 = 0xffffffff;
    local_350[0] = local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,", ","");
    local_328 = local_318;
    local_330 = 1;
    local_320 = 0;
    local_318[0] = 0;
    local_308 = 0xffffffff;
    plVar8 = local_2f0;
    local_300[0] = plVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_300,")\v","");
    __l_12._M_len = 5;
    __l_12._M_array = (iterator)local_3a8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x1e8),__l_12,(allocator_type *)psVar13);
    lVar14 = -200;
    do {
      if (plVar8 != (long *)plVar8[-2]) {
        operator_delete((long *)plVar8[-2],*plVar8 + 1);
      }
      plVar8 = plVar8 + -5;
      lVar14 = lVar14 + 0x28;
    } while (lVar14 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x220,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x3a) = 1;
  }
  if ((char)in_FS_OFFSET[-0x2f] == '\0') {
    lVar14 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x39] = lVar14 + -0x1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar14 + -0x1c8),"\\binom","");
    local_3e8._M_dataplus._M_p._0_2_ = 0x7b7b;
    psVar13 = &local_3c8;
    __l_13._M_len = 2;
    __l_13._M_array = (iterator)&local_3e8;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar14 + -0x1a8),__l_13,
               (allocator_type *)psVar13);
    local_3a8._0_4_ = 0xffffffff;
    local_3a0._M_p = local_398 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"choose(","");
    local_378 = local_368;
    local_380 = 0;
    local_370 = 0;
    local_368[0] = 0;
    local_358 = 0xffffffff;
    local_350[0] = local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,", ","");
    local_328 = local_318;
    local_330 = 1;
    local_320 = 0;
    local_318[0] = 0;
    local_308 = 0xffffffff;
    plVar8 = local_2f0;
    local_300[0] = plVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_300,")","");
    __l_14._M_len = 5;
    __l_14._M_array = (iterator)local_3a8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -400),__l_14,(allocator_type *)psVar13);
    lVar14 = -200;
    do {
      if (plVar8 != (long *)plVar8[-2]) {
        operator_delete((long *)plVar8[-2],*plVar8 + 1);
      }
      plVar8 = plVar8 + -5;
      lVar14 = lVar14 + 0x28;
    } while (lVar14 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x1c8,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x2f) = 1;
  }
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  pcVar3 = (expr_in->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e8,pcVar3,pcVar3 + expr_in->_M_string_length);
  util::trim(&local_3e8);
  if ((char *)local_3e8._M_string_length == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    goto LAB_001137bd;
  }
  if ((char *)0x5 < local_3e8._M_string_length) {
    std::__cxx11::string::substr((ulong)local_3a8,(ulong)&local_3e8);
    iVar6 = std::__cxx11::string::compare(local_3a8);
    if (iVar6 == 0) {
      bVar5 = (local_3e8._M_dataplus._M_p + -1)[local_3e8._M_string_length] == '}';
    }
    else {
      bVar5 = false;
    }
    if (local_3a8 != (undefined1  [8])local_398) {
      operator_delete((void *)local_3a8,local_398._0_8_ + 1);
    }
    if (bVar5) {
      std::__cxx11::string::substr((ulong)local_3a8,(ulong)&local_3e8);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_3a8,0,(char *)0x0,0x13211f);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar11) {
        lVar14 = plVar8[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar14;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      }
      __return_storage_ptr__->_M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_3a8 != (undefined1  [8])local_398) {
        operator_delete((void *)local_3a8,local_398._0_8_ + 1);
      }
      goto LAB_001137bd;
    }
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"\\left|","");
  src._M_str = _Var17._M_p;
  src._M_len = sVar4;
  to._M_str = "abs(";
  to._M_len = 4;
  util::str_replace((string *)local_3a8,src,&local_f0,to);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"\\right|","");
  src_00._M_str = _Var17._M_p;
  src_00._M_len = sVar4;
  to_00._M_str = ")";
  to_00._M_len = 1;
  util::str_replace((string *)local_3a8,src_00,&local_110,to_00);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\lfloor","");
  src_01._M_str = _Var17._M_p;
  src_01._M_len = sVar4;
  to_01._M_str = "floor(";
  to_01._M_len = 6;
  util::str_replace((string *)local_3a8,src_01,&local_130,to_01);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"\\rfloor","");
  src_02._M_str = _Var17._M_p;
  src_02._M_len = sVar4;
  to_02._M_str = ")";
  to_02._M_len = 1;
  util::str_replace((string *)local_3a8,src_02,&local_150,to_02);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"\\lceil|","");
  src_03._M_str = _Var17._M_p;
  src_03._M_len = sVar4;
  to_03._M_str = "ceil(";
  to_03._M_len = 5;
  util::str_replace((string *)local_3a8,src_03,&local_170,to_03);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"\\rceil|","");
  src_04._M_str = _Var17._M_p;
  src_04._M_len = sVar4;
  to_04._M_str = ")";
  to_04._M_len = 1;
  util::str_replace((string *)local_3a8,src_04,&local_190,to_04);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"\\left","");
  src_05._M_str = _Var17._M_p;
  src_05._M_len = sVar4;
  util::str_replace((string *)local_3a8,src_05,&local_1b0,(string_view)(ZEXT816(0x1334a1) << 0x40));
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"\\right","");
  src_06._M_str = _Var17._M_p;
  src_06._M_len = sVar4;
  util::str_replace((string *)local_3a8,src_06,&local_1d0,(string_view)(ZEXT816(0x1334a1) << 0x40));
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"\\cdot","");
  src_07._M_str = _Var17._M_p;
  src_07._M_len = sVar4;
  to_05._M_str = "*";
  to_05._M_len = 1;
  util::str_replace((string *)local_3a8,src_07,&local_1f0,to_05);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"\\le","");
  src_08._M_str = _Var17._M_p;
  src_08._M_len = sVar4;
  to_06._M_str = "<=";
  to_06._M_len = 2;
  util::str_replace((string *)local_3a8,src_08,&local_210,to_06);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"\\ge","");
  src_09._M_str = _Var17._M_p;
  src_09._M_len = sVar4;
  to_07._M_str = ">=";
  to_07._M_len = 2;
  util::str_replace((string *)local_3a8,src_09,&local_230,to_07);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"\\ne","");
  src_10._M_str = _Var17._M_p;
  src_10._M_len = sVar4;
  to_08._M_str = "!=";
  to_08._M_len = 2;
  util::str_replace((string *)local_3a8,src_10,&local_250,to_08);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"\\operatorname{and}","");
  src_11._M_str = _Var17._M_p;
  src_11._M_len = sVar4;
  to_09._M_str = "&";
  to_09._M_len = 1;
  util::str_replace((string *)local_3a8,src_11,&local_270,to_09);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"\\operatorname{or}","");
  src_12._M_str = _Var17._M_p;
  src_12._M_len = sVar4;
  to_10._M_str = "|";
  to_10._M_len = 1;
  util::str_replace((string *)local_3a8,src_12,&local_290,to_10);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_3e8._M_string_length;
  _Var17._M_p = local_3e8._M_dataplus._M_p;
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"\\operatorname{at}","");
  src_13._M_str = _Var17._M_p;
  src_13._M_len = sVar4;
  to_11._M_str = "@";
  to_11._M_len = 1;
  util::str_replace((string *)local_3a8,src_13,&local_2b0,to_11);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8,
             "\\\\operatorname\\{(.+?)\\}",0x10);
  local_3a0._M_p = (pointer)0x0;
  local_398._0_8_ = local_398._0_8_ & 0xffffffffffffff00;
  local_3a8 = (undefined1  [8])local_398;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_3e8._M_dataplus._M_p,
             (char *)(local_3e8._M_string_length + (long)local_3e8._M_dataplus._M_p),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8,"\\$1 ",4,0);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8,
             "\\\\text\\{(.+?)\\}",0x10);
  local_3a0._M_p = (pointer)0x0;
  local_398._0_8_ = local_398._0_8_ & 0xffffffffffffff00;
  local_3a8 = (undefined1  [8])local_398;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_3e8._M_dataplus._M_p,
             (char *)(local_3e8._M_string_length + (long)local_3e8._M_dataplus._M_p),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8,"$1",2,0);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8);
  lVar14 = 0;
  do {
    pcVar9 = (char *)strlen(*(char **)((long)latex_to_nivalis::SPECIAL_COMMANDS + lVar14));
    if (((pcVar9 < local_3e8._M_string_length) && (*local_3e8._M_dataplus._M_p == '\\')) &&
       (iVar6 = std::__cxx11::string::compare((ulong)&local_3e8,1,pcVar9), iVar6 == 0)) {
      *local_3e8._M_dataplus._M_p = '%';
    }
    lVar14 = lVar14 + 8;
  } while (lVar14 != 0x70);
  local_3a8 = (undefined1  [8])local_398;
  std::__cxx11::string::_M_construct((ulong)local_3a8,'\x01');
  std::__cxx11::string::reserve((ulong)local_3a8);
  if ((char *)0x1 < local_3e8._M_string_length) {
    pcVar9 = (char *)0x1;
    do {
      cVar16 = (char)local_3a8;
      if ((local_3e8._M_dataplus._M_p[(long)pcVar9] != '{') &&
         (((local_3e8._M_dataplus._M_p + -1)[(long)pcVar9] & 0xfeU) == 0x5e)) {
        std::__cxx11::string::push_back(cVar16);
        std::__cxx11::string::push_back(cVar16);
      }
      std::__cxx11::string::push_back(cVar16);
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 < local_3e8._M_string_length);
  }
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8,
             "\\\\(sin|cos|tan)( *?)\\^\\{-1\\}",0x10);
  local_3a0._M_p = (pointer)0x0;
  local_398._0_8_ = local_398._0_8_ & 0xffffffffffffff00;
  local_3a8 = (undefined1  [8])local_398;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_3e8._M_dataplus._M_p,
             (char *)(local_3e8._M_string_length + (long)local_3e8._M_dataplus._M_p),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8,"\\arc$1 ",7,0);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8,
             "\\\\frac\\{d\\}\\{d([a-zA-Z][a-zA-Z_0-9\\{\\}]*?)\\}",0x10);
  local_3a0._M_p = (pointer)0x0;
  local_398._0_8_ = local_398._0_8_ & 0xffffffffffffff00;
  local_3a8 = (undefined1  [8])local_398;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_3e8._M_dataplus._M_p,
             (char *)(local_3e8._M_string_length + (long)local_3e8._M_dataplus._M_p),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8,"diff($1)\v",9,0);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8);
  lVar14 = *in_FS_OFFSET;
  anon_unknown_1::ParenRule::operator()(&local_d0,(ParenRule *)(lVar14 + -0x328),&local_3e8);
  anon_unknown_1::ParenRule::operator()(&local_b0,(ParenRule *)(*in_FS_OFFSET + -0x430),&local_d0);
  anon_unknown_1::ParenRule::operator()(&local_90,(ParenRule *)(lVar14 + -0x3d8),&local_b0);
  anon_unknown_1::ParenRule::operator()(&local_70,(ParenRule *)(lVar14 + -0x2d0),&local_90);
  anon_unknown_1::ParenRule::operator()(&local_50,(ParenRule *)(lVar14 + -0x278),&local_70);
  anon_unknown_1::ParenRule::operator()(&local_2e0,(ParenRule *)(lVar14 + -0x220),&local_50);
  anon_unknown_1::ParenRule::operator()(&local_3c8,(ParenRule *)(lVar14 + -0x380),&local_2e0);
  anon_unknown_1::ParenRule::operator()
            ((string *)local_3a8,(ParenRule *)(lVar14 + -0x1c8),&local_3c8);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_2e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_3c8,'\x01');
  std::__cxx11::string::reserve((ulong)&local_3c8);
  c = *local_3e8._M_dataplus._M_p;
  local_3a8 = (undefined1  [8])0x0;
  local_3a0._M_p = local_3a0._M_p & 0xffffffff00000000;
  local_398._0_8_ = 0;
  local_398._8_4_ = 0;
  local_398._16_8_ = (_Bit_pointer)0x0;
  if (local_3e8._M_string_length < (char *)0x6) {
LAB_00113197:
    pcVar9 = (char *)0x1;
    if (((char *)0x1 < local_3e8._M_string_length) && (*local_3e8._M_dataplus._M_p == 0x25)) {
      pcVar9 = (char *)std::__cxx11::string::find((char)&local_3e8,0x20);
      std::__cxx11::string::substr((ulong)&local_2e0,(ulong)&local_3e8);
      goto LAB_0011320f;
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&local_2e0,(ulong)&local_3e8);
    iVar6 = std::__cxx11::string::compare((char *)&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if (iVar6 != 0) goto LAB_00113197;
    pcVar9 = (char *)std::__cxx11::string::find((char)&local_3e8,0x40);
    std::__cxx11::string::substr((ulong)&local_2e0,(ulong)&local_3e8);
LAB_0011320f:
    std::__cxx11::string::operator=((string *)&local_3c8,(string *)&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if (pcVar9 == (char *)0xffffffffffffffff) {
      pcVar9 = (char *)local_3e8._M_string_length;
    }
  }
  local_2b8 = __return_storage_ptr__;
  if (pcVar9 < local_3e8._M_string_length) {
    lVar14 = 0;
    local_2c0 = 0x800000000000003f;
    do {
      _Var17._M_p = local_3e8._M_dataplus._M_p;
      bVar2 = local_3e8._M_dataplus._M_p[(long)pcVar9];
      iVar6 = isspace((int)(char)bVar2);
      if (iVar6 == 0) {
        if (bVar2 == 0x7d) {
          uVar12 = (ulong)(uint)local_398._8_4_;
          if ((local_398._0_8_ - (long)local_3a8) * 8 + uVar12 != 0) {
            uVar10 = uVar12 - 1;
            uVar15 = uVar12 + 0x3e;
            if (-1 < (long)uVar10) {
              uVar15 = uVar10;
            }
            lVar14 = lVar14 - (ulong)((*(ulong *)(local_398._0_8_ + ((long)uVar15 >> 6) * 8 + -8 +
                                                 (ulong)((uVar10 & local_2c0) < 0x8000000000000001)
                                                 * 8) >> (uVar10 & 0x3f) & 1) != 0);
            local_398._8_4_ = local_398._8_4_ - 1;
            if (uVar12 == 0) {
              local_398._8_4_ = 0x3f;
              local_398._0_8_ = local_398._0_8_ - 8;
            }
          }
        }
        else if (bVar2 == 0x7b) {
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_3a8,c == 0x5f);
          uVar12 = (ulong)(uint)local_398._8_4_ - 1;
          uVar10 = (ulong)(uint)local_398._8_4_ + 0x3e;
          if (-1 < (long)uVar12) {
            uVar10 = uVar12;
          }
          lVar14 = lVar14 + (ulong)((*(ulong *)(((long)uVar10 >> 6) * 8 + local_398._0_8_ + -8 +
                                               (ulong)((uVar12 & local_2c0) < 0x8000000000000001) *
                                               8) >> (uVar12 & 0x3f) & 1) != 0);
          _Var17._M_p = local_3e8._M_dataplus._M_p;
        }
LAB_00113399:
        if (((((byte *)_Var17._M_p)[(long)pcVar9] != 0x5c) ||
            ((pcVar9 + 1 != (char *)local_3e8._M_string_length &&
             ((((byte *)_Var17._M_p + 1)[(long)pcVar9] == 0x20 ||
              (((byte *)_Var17._M_p + 1)[(long)pcVar9] == 0x7d)))))) ||
           (bVar5 = util::is_operator(c), bVar5)) {
          if (((c == 0x29) || (c == 0x7d)) || (c == 0x5d)) {
            bVar2 = local_3e8._M_dataplus._M_p[(long)pcVar9];
            bVar5 = util::is_operator(bVar2);
            if (!bVar5) {
              uVar7 = bVar2 - 0xb;
              if ((0x35 < uVar7) || ((0x20800240000001U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) {
                uVar7 = bVar2 - 0x5c;
                if (uVar7 < 0x22) {
                  uVar12 = 0x20000000b;
                  goto LAB_0011345f;
                }
                goto LAB_001135b4;
              }
            }
          }
LAB_00113469:
          bVar2 = local_3e8._M_dataplus._M_p[(long)pcVar9];
          if (((((bVar2 != 0x28) && (bVar2 != 0x7b)) && (bVar2 != 0x5b)) ||
              (bVar5 = util::is_operator(c), bVar5)) ||
             (((c - 0xb < 0x36 && ((0x20800220000001U >> ((ulong)(c - 0xb) & 0x3f) & 1) != 0)) ||
              ((c - 0x5b < 0x21 && ((0x100000013U >> ((ulong)(c - 0x5b) & 0x3f) & 1) != 0)))))) {
            if (((lVar14 == 0) &&
                ((((bVar2 = local_3e8._M_dataplus._M_p[(long)pcVar9],
                   (byte)((bVar2 & 0xdf) + 0xbf) < 0x1a ||
                   ((bVar2 - 0x24 < 0x3d &&
                    ((0x1800000010000009U >> ((ulong)(bVar2 - 0x24) & 0x3f) & 1) != 0)))) ||
                  (bVar2 == 0x2e || (byte)(bVar2 - 0x30) < 10)) && ((c != 0x24 && (c != 0x40))))))
               && ((((byte)((c & 0xdf) + 0xbf) < 0x1a ||
                    (((uVar7 = c - 0x27, uVar7 < 0x3a &&
                      ((0x300000002000001U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) ||
                     (c == 0x2e || (byte)(c - 0x30) < 10)))) &&
                   ((c == 0x2e || (byte)(c - 0x30) < 10) !=
                    (bVar2 == 0x2e || (byte)(bVar2 - 0x30) < 10))))) goto LAB_001135b4;
          }
          else {
            iVar6 = isalpha((int)(char)c);
            if ((iVar6 == 0) || (local_3e8._M_dataplus._M_p[(long)pcVar9] != 0x28))
            goto LAB_001135b4;
          }
        }
        else {
          if ((c - 0xb < 0x36) && ((0x20800220000001U >> ((ulong)(c - 0xb) & 0x3f) & 1) != 0))
          goto LAB_00113469;
          uVar7 = c - 0x5b;
          if (uVar7 < 0x21) {
            uVar12 = 0x100000013;
LAB_0011345f:
            if ((uVar12 >> ((ulong)uVar7 & 0x3f) & 1) != 0) goto LAB_00113469;
          }
LAB_001135b4:
          std::__cxx11::string::push_back((char)&local_3c8);
        }
        c = local_3e8._M_dataplus._M_p[(long)pcVar9];
        if (c == 0xb) {
          c = 0xb;
        }
        else {
          std::__cxx11::string::push_back((char)&local_3c8);
        }
      }
      else {
        if (bVar2 == 0xb) goto LAB_00113399;
        std::__cxx11::string::push_back((char)&local_3c8);
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 < local_3e8._M_string_length);
  }
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)&local_3c8);
  if (local_3a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_3a8,local_398._16_8_ - (long)local_3a8);
  }
  __return_storage_ptr__ = local_2b8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8,"_\\{(.+?)\\}\\*?",
             0x10);
  local_3a0._M_p = (pointer)0x0;
  local_398._0_8_ = local_398._0_8_ & 0xffffffffffffff00;
  local_3a8 = (undefined1  [8])local_398;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_3e8._M_dataplus._M_p,
             (char *)(local_3e8._M_string_length + (long)local_3e8._M_dataplus._M_p),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8,"$1",2,0);
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3c8);
  local_3a8 = (undefined1  [8])local_398;
  local_3a0._M_p = (pointer)0x0;
  local_398._0_8_ = local_398._0_8_ & 0xffffffffffffff00;
  std::__cxx11::string::reserve((ulong)local_3a8);
  if ((char *)local_3e8._M_string_length != (char *)0x0) {
    pcVar9 = (char *)0x0;
    do {
      if (local_3e8._M_dataplus._M_p[(long)pcVar9] != '\\') {
        std::__cxx11::string::push_back((char)local_3a8);
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 < local_3e8._M_string_length);
  }
  std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_3a8);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398._0_8_ + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p == &local_3e8.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_3e8.field_2._M_allocated_capacity._1_7_,local_3e8.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_3e8.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_3e8._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_3e8.field_2._M_allocated_capacity._1_7_,local_3e8.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_3e8._M_string_length;
  local_3e8._M_string_length = 0;
  local_3e8.field_2._M_local_buf[0] = '\0';
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
LAB_001137bd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,
                    CONCAT71(local_3e8.field_2._M_allocated_capacity._1_7_,
                             local_3e8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string latex_to_nivalis(const std::string& expr_in) {
#define NO_IMPLICIT_MULT "\v" // Special character used to indicate we should not add * here
    thread_local ParenRule
        l2n_nthroot { "\\sqrt", {'[', '{'},  // Input spec: prefix, paren types (end paren inferred)
            {"(", 1, ")^(1/(", 0, "))"} },   // Output spec: output arg order
        l2n_sqrt { "\\sqrt", {'{'},
            {"sqrt(", 0, ")"} },
        l2n_frac { "\\frac", {'{', '{'},
            {"((", 0, ")/(", 1, "))"} },
        l2n_logbase { "\\log_", {'{', '('},
            {"log(", 1, ", ", 0, ")"} },
        l2n_sum { "\\sum_", {'{', '^'},
            {"sum(", 0, ", ", 1, ")\v"} },
        l2n_prod { "\\prod_", {'{', '^'},
            {"prod(", 0, ", ", 1, ")\v"} },
        l2n_int { "\\int_", {'{', '^'},
            {"int(", 0, ", ", 1, ")\v"} },
        l2n_choose { "\\binom", {'{', '{'},
            {"choose(", 0, ", ", 1, ")"} };

    std::string expr = expr_in;
    util::trim(expr);
    if (expr.empty()) return "";
    if (expr.size() >= 6 && expr.substr(0, 6) == "\\text{" &&
           expr.back() == '}') {
        // Comment
        return "#" + expr.substr(6, expr.size() - 7);
    }

    expr = util::str_replace(expr, "\\left|", "abs(");
    expr = util::str_replace(expr, "\\right|", ")");
    expr = util::str_replace(expr, "\\lfloor", "floor(");
    expr = util::str_replace(expr, "\\rfloor", ")");
    expr = util::str_replace(expr, "\\lceil|", "ceil(");
    expr = util::str_replace(expr, "\\rceil|", ")");
    expr = util::str_replace(expr, "\\left", "");
    expr = util::str_replace(expr, "\\right", "");
    expr = util::str_replace(expr, "\\cdot", "*");
    expr = util::str_replace(expr, "\\le", "<=");
    expr = util::str_replace(expr, "\\ge", ">=");
    expr = util::str_replace(expr, "\\ne", "!=");
    expr = util::str_replace(expr, "\\operatorname{and}", "&");
    expr = util::str_replace(expr, "\\operatorname{or}", "|");
    expr = util::str_replace(expr, "\\operatorname{at}", "@");

    static const char*  SPECIAL_COMMANDS[] = {
        "poly", "fpoly", "Fpoly",
        "rect", "frect", "Frect",
        "circ", "fcirc", "Fcirc",
        "ellipse", "fellipse", "Fellipse",
        "text",
        "mandelbrot"
    };

    // Remove operatorname
    expr = std::regex_replace(expr,
            std::regex(R"(\\operatorname\{(.+?)\})"), "\\$1 ");

    // Remove text{}
    expr = std::regex_replace(expr,
            std::regex(R"(\\text\{(.+?)\})"), "$1");

    // Remap drawing commands
    for (size_t i = 0; i < sizeof(SPECIAL_COMMANDS) / sizeof(SPECIAL_COMMANDS[0]); ++i) {
        const size_t len = strlen(SPECIAL_COMMANDS[i]);
        if (expr.size() > len &&
                expr[0] == '\\' && expr.compare(1, len, SPECIAL_COMMANDS[i]) == 0) {
            expr[0] = '%';
        }
    }

    {
        std::string tmp(1, expr[0]);
        // Add braces so that x^22 -> x^{2}2,
        //                  log_22 -> log_{2}2
        tmp.reserve(expr.size());
        for (size_t i = 1; i < expr.size(); ++i) {
            if (expr[i] != '{' && (expr[i-1] == '_' || expr[i-1] == '^')) {
                tmp.push_back('{');
                tmp.push_back(expr[i]);
                tmp.push_back('}');
            } else {
                tmp.push_back(expr[i]);
            }
        }
        expr = std::move(tmp);
    }

    // Map (sin/cos/tan)^{-1} -> arg(..)
    expr = std::regex_replace(expr,
            std::regex(R"(\\(sin|cos|tan)( *?)\^\{-1\})"), "\\arc$1 ");

    // Diff
    expr = std::regex_replace(expr,
            std::regex(R"(\\frac\{d\}\{d([a-zA-Z][a-zA-Z_0-9\{\}]*?)\})"), "diff($1)" NO_IMPLICIT_MULT);

    // Apply parenthesis-based rules
    expr = l2n_choose(l2n_frac(l2n_int(
                    l2n_prod(l2n_sum(l2n_sqrt(
                                l2n_nthroot(l2n_logbase(expr))
                    )))
            )));

    // Implicit multiply
    {
        std::string tmp(1, expr[0]); tmp.reserve(expr.size());
        char last_nonspace = expr[0];
        std::vector<bool> brace_subs;
        size_t sub_level = 0; // subscript level

        auto is_opchar = [](char c, bool allow_open_brkt, bool allow_close_brkt) {
            return util::is_operator(c) ||
                util::is_control(c) ||
                (!allow_open_brkt && util::is_open_bracket(c)) ||
                (!allow_close_brkt && util::is_close_bracket(c)) ||
                c == '_' ||
                c == NO_IMPLICIT_MULT[0];
        };
        size_t i = 1;
        if (expr.size() > 5 && expr.substr(0, 5) == "%text") {
            i = expr.find('@');
            tmp = expr.substr(0, i);
            if (i == std::string::npos) i = expr.size();
        } else if (expr.size() > 1 && expr[0] == '%') {
            i = expr.find(' ');
            tmp = expr.substr(0, i);
            if (i == std::string::npos) i = expr.size();
        }
        for (; i < expr.size(); ++i) {
            if (std::isspace(expr[i]) && expr[i] != NO_IMPLICIT_MULT[0]) {
                tmp.push_back(expr[i]);
                continue;
            }
            if (expr[i] == '{') {
                brace_subs.push_back(last_nonspace == '_');
                if (brace_subs.back()) sub_level++;
            } else if (expr[i] == '}') {
                if (brace_subs.size()) {
                    if (brace_subs.back()) sub_level--;
                    brace_subs.pop_back();
                }
            }
            if ((expr[i] == '\\' &&
                    (i + 1 == expr.size() ||
                     (expr[i+1] != '}' && expr[i+1] != ' ')) && // not '\}' or '\ '
                    !is_opchar(last_nonspace, false, true)) ||
                (util::is_close_bracket(last_nonspace) &&
                    !is_opchar(expr[i], true, false))) {
                tmp.push_back('*');
            } else if (util::is_open_bracket(expr[i]) &&
                    !is_opchar(last_nonspace, false, true)){
                if (!std::isalpha(last_nonspace) || expr[i] != '(')  // not beginning of call
                    tmp.push_back('*');
            } else if (sub_level == 0 &&
                       util::is_identifier(expr[i]) && last_nonspace != '$' && last_nonspace != '@' &&
                       util::is_identifier(last_nonspace) &&
                       util::is_numeric(expr[i]) !=
                       util::is_numeric(last_nonspace)) {
                tmp.push_back('*');
            }
            last_nonspace = expr[i];
            if (expr[i] != NO_IMPLICIT_MULT[0])
                tmp.push_back(expr[i]);
        }
        expr = std::move(tmp);
    }

    // Subscript
    expr = std::regex_replace(expr,
            std::regex(R"(_\{(.+?)\}\*?)"), "$1");

    // Remove any remaining backslashes, convert {}
    {
        std::string tmp; tmp.reserve(expr.size());
        for (size_t i = 0; i < expr.size(); ++i) {
            if (expr[i] == '{' && (i == 0 || expr[i-1] != '\\')) {
                tmp.push_back('(');
            } else if (expr[i] == '}' && (i == 0 || expr[i-1] != '\\')) {
                tmp.push_back(')');
            } else if (expr[i] != '\\') {
                tmp.push_back(expr[i]);
            }
        }
        expr = std::move(tmp);
    }
    return expr;
}